

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

void freestack(lua_State *L)

{
  lua_State *L_local;
  
  if (L->stack != (StkId)0x0) {
    L->ci = &L->base_ci;
    luaE_freeCI(L);
    if (L->nci != 0) {
      __assert_fail("L->nci == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                    ,0xb1,"void freestack(lua_State *)");
    }
    luaM_realloc_(L,L->stack,(long)L->stacksize << 4,0);
  }
  return;
}

Assistant:

static void freestack (lua_State *L) {
  if (L->stack == NULL)
    return;  /* stack not completely built yet */
  L->ci = &L->base_ci;  /* free the entire 'ci' list */
  luaE_freeCI(L);
  lua_assert(L->nci == 0);
  luaM_freearray(L, L->stack, L->stacksize);  /* free stack array */
}